

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeMemoryReportFormatter.cpp
# Opt level: O1

bool __thiscall
CodeMemoryReportFormatter::variableExists
          (CodeMemoryReportFormatter *this,SimpleString *variableName)

{
  CodeReportingAllocationNode *otherBuffer;
  bool bVar1;
  bool bVar2;
  SimpleString SStack_38;
  
  otherBuffer = this->codeReportingList_;
  while( true ) {
    bVar1 = otherBuffer != (CodeReportingAllocationNode *)0x0;
    if (!bVar1) {
      return bVar1;
    }
    SimpleString::SimpleString(&SStack_38,otherBuffer->variableName_);
    bVar2 = operator==(variableName,&SStack_38);
    SimpleString::~SimpleString(&SStack_38);
    if (bVar2) break;
    otherBuffer = otherBuffer->next_;
  }
  return bVar1;
}

Assistant:

bool CodeMemoryReportFormatter::variableExists(const SimpleString& variableName)
{
    CodeReportingAllocationNode* current = codeReportingList_;
    while (current) {
        if (variableName == current->variableName_)
            return true;
        current = current->next_;
    }
    return false;
}